

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O3

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
          (DefaultShaderSourceStreamFactory *this,IReferenceCounters *pRefCounters,
          Char *SearchDirectories)

{
  char *pcVar1;
  char cVar2;
  _Alloc_hider in_RCX;
  char *pcVar3;
  String SearchPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  RefCountedObject<Diligent::IShaderSourceInputStreamFactory>::RefCountedObject<>
            ((RefCountedObject<Diligent::IShaderSourceInputStreamFactory> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>).
  super_RefCountedObject<Diligent::IShaderSourceInputStreamFactory>.
  super_IShaderSourceInputStreamFactory.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00930270;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((SearchDirectories != (Char *)0x0) && (cVar2 = *SearchDirectories, cVar2 != '\0')) {
    do {
      while (cVar2 == ';') {
        pcVar3 = SearchDirectories + 1;
        SearchDirectories = SearchDirectories + 1;
        cVar2 = *pcVar3;
      }
      pcVar3 = SearchDirectories;
      if (cVar2 == '\0') break;
      do {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        if (*pcVar1 == ';') break;
      } while (*pcVar1 != '\0');
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,SearchDirectories,pcVar3);
      if (local_70._M_string_length == 0) {
        FormatString<char[26],char[20]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"!SearchPath.empty()",(char (*) [20])in_RCX._M_p);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                   ,0x3e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      in_RCX._M_p = local_70._M_dataplus._M_p;
      if ((local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '/') &&
         (local_70._M_dataplus._M_p[local_70._M_string_length - 1] != '\\')) {
        std::__cxx11::string::push_back((char)&local_70);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_SearchDirectories,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      cVar2 = *pcVar3;
      SearchDirectories = pcVar3;
    } while (cVar2 != '\0');
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_SearchDirectories,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory(IReferenceCounters* pRefCounters, const Char* SearchDirectories) :
    ObjectBase<IShaderSourceInputStreamFactory>(pRefCounters)
{
    FileSystem::SplitPathList(SearchDirectories,
                              [&](const char* Path, size_t Len) //
                              {
                                  String SearchPath{Path, Len};
                                  VERIFY_EXPR(!SearchPath.empty());
                                  if (!FileSystem::IsSlash(SearchPath.back()))
                                      SearchPath.push_back(FileSystem::SlashSymbol);
                                  m_SearchDirectories.emplace_back(std::move(SearchPath));
                                  return true;
                              });
    m_SearchDirectories.push_back("");
}